

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

int buffer_close(buffer_t *buffer)

{
  int iVar1;
  uint uVar2;
  
  if (buffer->f < 0) {
    g_hash_table_unref(buffer->comments);
    uVar2 = 0;
    if (buffer->highlights != (GSList *)0x0) {
      g_slist_free_full(buffer->highlights,g_free);
      uVar2 = 0;
    }
  }
  else {
    iVar1 = munmap(buffer->data,buffer->size);
    if (iVar1 != 0) {
      perror("munmap");
    }
    uVar2 = (uint)(iVar1 != 0);
    iVar1 = close(buffer->f);
    if (iVar1 != 0) {
      perror("close");
      uVar2 = 1;
    }
    g_hash_table_unref(buffer->comments);
    if (buffer->highlights != (GSList *)0x0) {
      g_slist_free_full(buffer->highlights,g_free);
    }
    free(buffer->path);
  }
  return uVar2;
}

Assistant:

int
buffer_close(buffer_t *buffer)
{
    if (buffer->f < 0) {
        g_hash_table_unref(buffer->comments);
        if (buffer->highlights) {
            g_slist_free_full(buffer->highlights, g_free);
        }
        return 0;
    }

    int status = 0;

    if (munmap(buffer->data, buffer->size) != 0) {
        perror("munmap");
        status = 1;
    }

    if (close(buffer->f) != 0) {
        perror("close");
        status = 1;
    }

    g_hash_table_unref(buffer->comments);
    if (buffer->highlights) {
        g_slist_free_full(buffer->highlights, g_free);
    }
    free((void*) buffer->path);
    return status;
}